

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

ident * writeident(char *name,int flags)

{
  anon_union_8_3_558327c1_for_ident_6 *paVar1;
  uint uVar2;
  uint *puVar3;
  ident *piVar4;
  
  piVar4 = newident(name,flags);
  uVar2 = piVar4->index;
  if (((long)(int)uVar2 < 0x19) && (((uint)aliasstack->usedargs >> (uVar2 & 0x1f) & 1) == 0)) {
    paVar1 = (anon_union_8_3_558327c1_for_ident_6 *)(aliasstack->argstack + (int)uVar2);
    *paVar1 = piVar4->field_4;
    *(anon_union_4_3_c060dbb1_for_ident_2 *)(paVar1 + 1) = piVar4->field_2;
    paVar1[2] = *(anon_union_8_3_558327c1_for_ident_6 *)&piVar4->field_5;
    (piVar4->field_5).stack = (identstack *)paVar1;
    (piVar4->field_2).minval = nullval.super_tagval.type;
    (piVar4->field_4).val.field_0 = nullval.super_tagval.super_identval.field_0;
    puVar3 = (piVar4->field_3).code;
    if (puVar3 != (uint *)0x0) {
      *puVar3 = *puVar3 - 0x100;
      if ((int)*(piVar4->field_3).code < 0x100) {
        operator_delete__((piVar4->field_3).code);
      }
      (piVar4->field_3).code = (uint *)0x0;
    }
    aliasstack->usedargs = aliasstack->usedargs | 1 << ((byte)piVar4->index & 0x1f);
  }
  return piVar4;
}

Assistant:

ident *writeident(const char *name, int flags)
{
    ident *id = newident(name, flags);
    if(id->index < MAXARGS && !(aliasstack->usedargs&(1<<id->index)))
    {
        pusharg(*id, nullval, aliasstack->argstack[id->index]);
        aliasstack->usedargs |= 1<<id->index;
    }
    return id;
}